

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  DecodeStatus DVar4;
  uint uVar5;
  MCOperand *op;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t Address_00;
  DecodeStatus DVar6;
  uint RegNo;
  
  uVar2 = MCInst_getOpcode(Inst);
  if ((((7 < uVar2 - 0x93) ||
       (Decoder = (MCOperand *)0xa5, (0xa5U >> (uVar2 - 0x93 & 0x1f) & 1) == 0)) && (uVar2 != 0x946)
      ) && ((uVar2 != 0x949 && (uVar2 != 0xa30)))) {
    bVar1 = false;
    uVar3 = 0;
    Address_00 = extraout_RDX;
    if (uVar2 != 0xa2e) goto LAB_001cba21;
  }
  op = MCInst_getOperand(Inst,0);
  uVar3 = MCOperand_getReg(op);
  bVar1 = true;
  Address_00 = extraout_RDX_00;
LAB_001cba21:
  if (Val != 0) {
    DVar6 = MCDisassembler_Success;
    for (RegNo = 0; RegNo != 0x10; RegNo = RegNo + 1) {
      if ((Val >> (RegNo & 0x1f) & 1) != 0) {
        DVar4 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
        if (DVar4 != MCDisassembler_Success) {
          if (DVar4 != MCDisassembler_SoftFail) {
            return MCDisassembler_Fail;
          }
          DVar6 = MCDisassembler_SoftFail;
        }
        Address_00 = extraout_RDX_01;
        if ((bVar1) &&
           (Decoder = Inst->Operands,
           uVar5 = MCOperand_getReg(Inst->Operands + ((ulong)Inst->size - 1)),
           Address_00 = extraout_RDX_02, uVar3 == uVar5)) {
          DVar6 = MCDisassembler_SoftFail;
        }
      }
    }
    if (uVar3 != 0xc || uVar2 != 0x949) {
      return DVar6;
    }
    if ((~Val & 0xc000) != 0 && (Val >> 0xd & 1) == 0) {
      return DVar6;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	unsigned i;
	DecodeStatus S = MCDisassembler_Success;
	unsigned opcode;

	bool NeedDisjointWriteback = false;
	unsigned WritebackReg = 0;

	opcode = MCInst_getOpcode(Inst);
	switch (opcode) {
		default:
			break;
		case ARM_LDMIA_UPD:
		case ARM_LDMDB_UPD:
		case ARM_LDMIB_UPD:
		case ARM_LDMDA_UPD:
		case ARM_t2LDMIA_UPD:
		case ARM_t2LDMDB_UPD:
		case ARM_t2STMIA_UPD:
		case ARM_t2STMDB_UPD:
			NeedDisjointWriteback = true;
			WritebackReg = MCOperand_getReg(MCInst_getOperand(Inst, 0));
			break;
	}

	// Empty register lists are not allowed.
	if (Val == 0) return MCDisassembler_Fail;
	for (i = 0; i < 16; ++i) {
		if (Val & (1 << i)) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, i, Address, Decoder)))
				return MCDisassembler_Fail;
			// Writeback not allowed if Rn is in the target list.
			if (NeedDisjointWriteback && WritebackReg == MCOperand_getReg(&(Inst->Operands[Inst->size-1])))
				Check(&S, MCDisassembler_SoftFail);
		}
	}

	if (opcode == ARM_t2LDMIA_UPD && WritebackReg == ARM_SP) {
		if (Val & (1 << 13) || ((Val & (1 << 15)) && (Val & (1 << 14)))) {
			// invalid thumb2 pop
			// needs no sp in reglist and not both pc and lr set at the same time
			return MCDisassembler_Fail;
		}
	}

	return S;
}